

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O1

int WebPPlaneDistortion(uint8_t *src,size_t src_stride,uint8_t *ref,size_t ref_stride,int width,
                       int height,size_t x_step,int type,float *distortion,float *result)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint8_t *ptr;
  long lVar4;
  ulong uVar5;
  code *pcVar6;
  code *pcVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  ulong uVar11;
  uint8_t *puVar12;
  ulong uVar13;
  double dVar14;
  
  pcVar7 = AccumulateLSIM;
  if (type == 1) {
    pcVar7 = AccumulateSSIM;
  }
  pcVar6 = AccumulateSSE;
  if (type != 0) {
    pcVar6 = pcVar7;
  }
  iVar2 = 0;
  iVar3 = 0;
  if (ref != (uint8_t *)0x0 && src != (uint8_t *)0x0) {
    uVar13 = (ulong)(uint)width;
    uVar5 = (long)width * x_step;
    iVar3 = 0;
    if ((((uVar5 < src_stride || uVar5 - src_stride == 0) &&
         (iVar3 = iVar2, distortion != (float *)0x0)) &&
        (uVar5 < ref_stride || uVar5 - ref_stride == 0)) && (result != (float *)0x0)) {
      VP8SSIMDspInit();
      puVar9 = ref;
      puVar12 = src;
      if (x_step == 1) {
        ptr = (uint8_t *)0x0;
      }
      else {
        lVar4 = (long)width * (long)height;
        ptr = (uint8_t *)WebPSafeMalloc(lVar4 * 2,1);
        if (ptr != (uint8_t *)0x0) {
          puVar9 = ptr + lVar4;
          puVar12 = ptr;
          if (0 < height) {
            uVar5 = 0;
            puVar8 = ptr;
            puVar10 = puVar9;
            do {
              if (0 < width) {
                lVar4 = 0;
                uVar11 = 0;
                do {
                  puVar8[uVar11] = src[lVar4];
                  puVar10[uVar11] = ref[lVar4];
                  uVar11 = uVar11 + 1;
                  lVar4 = lVar4 + x_step;
                } while (uVar13 != uVar11);
              }
              uVar5 = uVar5 + 1;
              puVar10 = puVar10 + uVar13;
              puVar8 = puVar8 + uVar13;
              ref = ref + ref_stride;
              src = src + src_stride;
            } while (uVar5 != (uint)height);
          }
        }
        if (ptr == (uint8_t *)0x0) {
          return 0;
        }
      }
      dVar14 = (double)(*pcVar6)(puVar12,uVar13,puVar9,uVar13,uVar13);
      *distortion = (float)dVar14;
      WebPSafeFree(ptr);
      fVar1 = *distortion;
      if (type == 1) {
        uVar13 = -(ulong)(0.0 < (double)height * (double)width);
        dVar14 = (double)(~uVar13 & 0x3ff0000000000000 |
                         (ulong)((double)fVar1 / ((double)height * (double)width)) & uVar13);
        if (1.0 <= dVar14) {
          dVar14 = 99.0;
        }
        else {
          dVar14 = log10(1.0 - dVar14);
          dVar14 = dVar14 * -10.0;
        }
      }
      else {
        dVar14 = 99.0;
        if ((0.0 < (double)height * (double)width) && (0.0 < fVar1)) {
          dVar14 = log((double)fVar1 / ((double)height * (double)width * 255.0 * 255.0));
          dVar14 = dVar14 * -4.3429448;
        }
      }
      *result = (float)dVar14;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int WebPPlaneDistortion(const uint8_t* src, size_t src_stride,
                        const uint8_t* ref, size_t ref_stride,
                        int width, int height, size_t x_step,
                        int type, float* distortion, float* result) {
  uint8_t* allocated = NULL;
  const AccumulateFunc metric = (type == 0) ? AccumulateSSE :
                                (type == 1) ? AccumulateSSIM :
                                              AccumulateLSIM;
  if (src == NULL || ref == NULL ||
      src_stride < x_step * width || ref_stride < x_step * width ||
      result == NULL || distortion == NULL) {
    return 0;
  }

  VP8SSIMDspInit();
  if (x_step != 1) {   // extract a packed plane if needed
    int x, y;
    uint8_t* tmp1;
    uint8_t* tmp2;
    allocated =
        (uint8_t*)WebPSafeMalloc(2ULL * width * height, sizeof(*allocated));
    if (allocated == NULL) return 0;
    tmp1 = allocated;
    tmp2 = tmp1 + (size_t)width * height;
    for (y = 0; y < height; ++y) {
      for (x = 0; x < width; ++x) {
        tmp1[x + y * width] = src[x * x_step + y * src_stride];
        tmp2[x + y * width] = ref[x * x_step + y * ref_stride];
      }
    }
    src = tmp1;
    ref = tmp2;
  }
  *distortion = (float)metric(src, width, ref, width, width, height);
  WebPSafeFree(allocated);

  *result = (type == 1) ? (float)GetLogSSIM(*distortion, (double)width * height)
                        : (float)GetPSNR(*distortion, (double)width * height);
  return 1;
}